

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
PreciseMeasurement_helpConstructors_Test::TestBody(PreciseMeasurement_helpConstructors_Test *this)

{
  unit_data *puVar1;
  unit_data *puVar2;
  bool bVar3;
  char *pcVar4;
  char *in_R9;
  string local_3d0;
  AssertHelper local_3b0;
  Message local_3a8;
  precise_unit local_3a0;
  bool local_389;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__5;
  Message local_370;
  double local_368;
  double local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_3;
  precise_measurement rat;
  AssertHelper local_310;
  Message local_308;
  precise_unit local_300;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__4;
  Message local_2d0;
  double local_2c8;
  double local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_2;
  precise_measurement diff;
  AssertHelper local_270;
  Message local_268;
  precise_measurement local_260;
  precise_measurement local_248;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1f8;
  Message local_1f0;
  precise_unit local_1e8;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__2;
  Message local_1b8;
  double local_1b0;
  double local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  precise_measurement sum;
  AssertHelper local_158;
  Message local_150;
  precise_measurement local_148;
  precise_measurement local_130;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e0;
  Message local_d8;
  precise_unit local_d0;
  precise_unit local_c0;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  Message local_90 [3];
  double local_78;
  double local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  precise_measurement area;
  precise_measurement d2;
  precise_measurement d1;
  PreciseMeasurement_helpConstructors_Test *this_local;
  
  puVar1 = &d2.units_.base_units_;
  units::operator*((precise_measurement *)puVar1,45.0,(precise_unit *)units::precise::m);
  puVar2 = &area.units_.base_units_;
  units::operator*((precise_measurement *)puVar2,(precise_unit *)units::precise::m,79.0);
  units::precise_measurement::operator*
            ((precise_measurement *)&gtest_ar.message_,(precise_measurement *)puVar1,
             (precise_measurement *)puVar2);
  local_70 = units::precise_measurement::value((precise_measurement *)&gtest_ar.message_);
  local_78 = 3555.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_68,"area.value()","45.0 * 79",&local_70,&local_78);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar3) {
    testing::Message::Message(local_90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x220,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_c0 = units::precise_measurement::units((precise_measurement *)&gtest_ar.message_);
  local_d0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::m,(precise_unit *)units::precise::m);
  local_a9 = units::precise_unit::operator==(&local_c0,&local_d0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar3) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_a8,
               (AssertionResult *)"area.units() == precise::m * precise::m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x221,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  puVar1 = &d2.units_.base_units_;
  puVar2 = &area.units_.base_units_;
  units::precise_measurement::operator*
            (&local_130,(precise_measurement *)puVar1,(precise_measurement *)puVar2);
  units::precise_measurement::operator*
            (&local_148,(precise_measurement *)puVar2,(precise_measurement *)puVar1);
  local_111 = units::precise_measurement::operator==(&local_130,&local_148);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar3) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sum.units_.base_units_,(internal *)local_110,
               (AssertionResult *)"d1 * d2 == d2 * d1","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x223,pcVar4);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&sum.units_.base_units_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  units::precise_measurement::operator+
            ((precise_measurement *)&gtest_ar_1.message_,
             (precise_measurement *)&d2.units_.base_units_,
             (precise_measurement *)&area.units_.base_units_);
  local_1a8 = units::precise_measurement::value((precise_measurement *)&gtest_ar_1.message_);
  local_1b0 = 124.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1a0,"sum.value()","45.0 + 79.0",&local_1a8,&local_1b0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar3) {
    testing::Message::Message(&local_1b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x226,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1e8 = units::precise_measurement::units((precise_measurement *)&gtest_ar_1.message_);
  local_1d1 = units::precise_unit::operator==(&local_1e8,(precise_unit *)units::precise::m);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar3) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1d0,
               (AssertionResult *)"sum.units() == precise::m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x227,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  puVar1 = &d2.units_.base_units_;
  puVar2 = &area.units_.base_units_;
  units::precise_measurement::operator+
            (&local_248,(precise_measurement *)puVar1,(precise_measurement *)puVar2);
  units::precise_measurement::operator+
            (&local_260,(precise_measurement *)puVar2,(precise_measurement *)puVar1);
  local_229 = units::precise_measurement::operator==(&local_248,&local_260);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar3) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&diff.units_.base_units_,(internal *)local_228,
               (AssertionResult *)"d1 + d2 == d2 + d1","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x228,pcVar4);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    std::__cxx11::string::~string((string *)&diff.units_.base_units_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  units::precise_measurement::operator-
            ((precise_measurement *)&gtest_ar_2.message_,
             (precise_measurement *)&area.units_.base_units_,
             (precise_measurement *)&d2.units_.base_units_);
  local_2c0 = units::precise_measurement::value((precise_measurement *)&gtest_ar_2.message_);
  local_2c8 = 34.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2b8,"diff.value()","79.0 - 45",&local_2c0,&local_2c8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar3) {
    testing::Message::Message(&local_2d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x22b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_300 = units::precise_measurement::units((precise_measurement *)&gtest_ar_2.message_);
  local_2e9 = units::precise_unit::operator==(&local_300,(precise_unit *)units::precise::m);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar3) {
    testing::Message::Message(&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rat.units_.base_units_,(internal *)local_2e8,
               (AssertionResult *)"diff.units() == precise::m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x22c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&rat.units_.base_units_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  units::precise_measurement::operator/
            ((precise_measurement *)&gtest_ar_3.message_,
             (precise_measurement *)&d2.units_.base_units_,
             (precise_measurement *)&area.units_.base_units_);
  local_360 = units::precise_measurement::value((precise_measurement *)&gtest_ar_3.message_);
  local_368 = 0.569620253164557;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_358,"rat.value()","45.0 / 79",&local_360,&local_368);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar3) {
    testing::Message::Message(&local_370);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x22f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  local_3a0 = units::precise_measurement::units((precise_measurement *)&gtest_ar_3.message_);
  local_389 = units::precise_unit::operator==(&local_3a0,(unit *)&units::ratio);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_388,&local_389,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar3) {
    testing::Message::Message(&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3d0,(internal *)local_388,(AssertionResult *)"rat.units() == ratio","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x230,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  return;
}

Assistant:

TEST(PreciseMeasurement, helpConstructors)
{
    auto d1 = 45.0 * precise::m;
    auto d2 = precise::m * 79.0;

    static_assert(
        std::is_same<decltype(d1), decltype(d2)>::value,
        "Types are not producing same measurement type");

    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == precise::m * precise::m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == precise::m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == precise::m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79);
    EXPECT_TRUE(rat.units() == ratio);
}